

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tscan<int>(VM *this)

{
  bool bVar1;
  long *plVar2;
  IOError *this_00;
  int_t local_14;
  VM *pVStack_10;
  int value;
  VM *this_local;
  
  pVStack_10 = this;
  plVar2 = (long *)std::istream::operator>>((istream *)&std::cin,&local_14);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if (!bVar1) {
    this_00 = (IOError *)__cxa_allocate_exception(8);
    IOError::IOError(this_00);
    __cxa_throw(this_00,&IOError::typeinfo,IOError::~IOError);
  }
  PUSH<int>(this,local_14);
  return;
}

Assistant:

void VM::Tscan() {
    if (T value; std::cin >> value) {
        PUSH(value);
    }
    else {
        throw IOError();
    }
}